

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall
despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttributeSet *this,TiXmlAttribute *addMe)

{
  Rep *pRVar1;
  int iVar2;
  TiXmlAttribute *pTVar3;
  
  pRVar1 = (addMe->name).rep_;
  pTVar3 = &this->sentinel;
  do {
    pTVar3 = pTVar3->next;
    if (pTVar3 == &this->sentinel) {
      addMe->next = &this->sentinel;
      pTVar3 = (this->sentinel).prev;
      addMe->prev = pTVar3;
      pTVar3->next = addMe;
      (this->sentinel).prev = addMe;
      return;
    }
    iVar2 = strcmp(((pTVar3->name).rep_)->str,pRVar1->str);
  } while (iVar2 != 0);
  __assert_fail("!Find(addMe->Name())",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                ,0x516,"void despot::util::tinyxml::TiXmlAttributeSet::Add(TiXmlAttribute *)");
}

Assistant:

void TiXmlAttributeSet::Add(TiXmlAttribute* addMe) {
#ifdef TIXML_USE_STL
	assert( !Find( TIXML_STRING( addMe->Name() ) ) ); // Shouldn't be multiply adding to the set.
#else
	assert(!Find(addMe->Name())); // Shouldn't be multiply adding to the set.
#endif

	addMe->next = &sentinel;
	addMe->prev = sentinel.prev;

	sentinel.prev->next = addMe;
	sentinel.prev = addMe;
}